

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O0

pair<int,_int> __thiscall asn1::MemBuffer::readDERHead(MemBuffer *this)

{
  byte bVar1;
  pair<int,_int> pVar2;
  uint local_24;
  uint local_20;
  int l;
  int len;
  int id;
  MemBuffer *this_local;
  
  _len = this;
  bVar1 = read<unsigned_char>(this);
  l = (int)bVar1;
  bVar1 = read<unsigned_char>(this);
  local_20 = (uint)bVar1;
  if ((bVar1 & 0x80) != 0) {
    local_24 = local_20 & 0x7f;
    local_20 = 0;
    while (local_24 != 0) {
      local_20 = local_20 << 8;
      bVar1 = read<unsigned_char>(this);
      local_20 = bVar1 | local_20;
      local_24 = local_24 - 1;
    }
  }
  pVar2 = std::make_pair<int&,int&>(&l,(int *)&local_20);
  return pVar2;
}

Assistant:

std::pair<int, int> readDERHead()
    {
        int id = read<uint8_t>();
        int len = read<uint8_t>();
        if (len & 0x80) {
            int l = len & 0x7f;
            len = 0;
            while (l--) {
                len <<= 8;
                len |= read<uint8_t>();
            }
        }
        return std::make_pair(id, len);
    }